

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O3

bool tinyusdz::io::ReadFileHeader
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,string *err,
               string *filepath,uint32_t max_read_bytes,void *userdata)

{
  pointer puVar1;
  long *plVar2;
  ulong uVar3;
  long *plVar4;
  bool bVar5;
  uint32_t uVar6;
  char *__lhs;
  long *plVar7;
  ulong __new_size;
  ifstream f;
  long local_268;
  long lStack_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  uVar6 = 0x100000;
  if (max_read_bytes < 0x100000) {
    uVar6 = max_read_bytes;
  }
  ::std::ifstream::ifstream(local_238,(filepath->_M_dataplus)._M_p,_S_bin);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    ::std::istream::peek();
    if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
      ::std::istream::seekg((long)local_238,_S_beg);
      uVar3 = ::std::istream::tellg();
      ::std::istream::seekg((long)local_238,_S_beg);
      if ((long)uVar3 < 0) {
        if (err != (string *)0x0) {
          ::std::operator+(&local_258,"Invalid file size : ",filepath);
          goto LAB_002b206b;
        }
      }
      else if (uVar3 == 0x7fffffffffffffff) {
        if (err != (string *)0x0) {
          __lhs = "Invalid File(Pipe or special device?) : ";
          goto LAB_002b2054;
        }
      }
      else if (uVar3 == 0) {
        if (err != (string *)0x0) {
          __lhs = "File is empty : ";
          goto LAB_002b2054;
        }
      }
      else {
        __new_size = (ulong)(uVar6 + (uVar6 == 0));
        if (uVar3 < __new_size) {
          __new_size = uVar3;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)out,__new_size);
        puVar1 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish == puVar1) {
          ::std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
        }
        ::std::istream::read((char *)local_238,(long)puVar1);
        if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
          bVar5 = true;
          goto LAB_002b20f6;
        }
        if (err != (string *)0x0) {
          __lhs = "Failed to read file: ";
          goto LAB_002b2054;
        }
      }
    }
    else if (err != (string *)0x0) {
      __lhs = "File read error. Maybe empty file or invalid file : ";
      goto LAB_002b2054;
    }
  }
  else if (err != (string *)0x0) {
    __lhs = "File does not exit or open error : ";
LAB_002b2054:
    ::std::operator+(&local_258,__lhs,filepath);
LAB_002b206b:
    plVar2 = (long *)::std::__cxx11::string::append((char *)&local_258);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_268 = *plVar4;
      lStack_260 = plVar2[3];
      plVar7 = &local_268;
    }
    else {
      local_268 = *plVar4;
      plVar7 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)err,(ulong)plVar7);
    if (plVar7 != &local_268) {
      operator_delete(plVar7,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
  }
  bVar5 = false;
LAB_002b20f6:
  ::std::ifstream::~ifstream(local_238);
  return bVar5;
}

Assistant:

bool ReadFileHeader(std::vector<uint8_t> *out, std::string *err,
                    const std::string &filepath, uint32_t max_read_bytes,
                    void *userdata) {
  (void)userdata;

  // hard limit to 1MB.
  max_read_bytes =
      (std::max)(1u, (std::min)(uint32_t(1024 * 1024), max_read_bytes));

#ifdef TINYUSDZ_ANDROID_LOAD_FROM_ASSETS
  if (tinyusdz::io::asset_manager) {
    AAsset *asset = AAssetManager_open(asset_manager, filepath.c_str(),
                                       AASSET_MODE_STREAMING);
    if (!asset) {
      if (err) {
        (*err) += "File open error(from AssestManager) : " + filepath + "\n";
      }
      return false;
    }
    off_t len = AAsset_getLength(asset);
    if (len <= 0) {
      if (err) {
        (*err) += "Invalid file size : " + filepath +
                  " (does the path point to a directory?)";
      }
      return false;
    }

    size_t size = size_t(len);

    size = (std::min)(size_t(max_read_bytes), size);
    out->resize(size);
    AAsset_read(asset, reinterpret_cast<char *>(&out->at(0)), size);
    AAsset_close(asset);
    return true;
  } else {
    if (err) {
      (*err) += "No asset manager specified : " + filepath + "\n";
    }
    return false;
  }

#else
#ifdef _WIN32
#if defined(__GLIBCXX__)  // mingw
  int file_descriptor =
      _wopen(UTF8ToWchar(filepath).c_str(), _O_RDONLY | _O_BINARY);
  __gnu_cxx::stdio_filebuf<char> wfile_buf(file_descriptor, std::ios_base::in);
  std::istream f(&wfile_buf);
#elif defined(_MSC_VER) || defined(_LIBCPP_VERSION)
  // For libcxx, assume _LIBCPP_HAS_OPEN_WITH_WCHAR is defined to accept
  // `wchar_t *`
  std::ifstream f(UTF8ToWchar(filepath).c_str(), std::ifstream::binary);
#else
  // Unknown compiler/runtime
  std::ifstream f(filepath.c_str(), std::ifstream::binary);
#endif
#else
  std::ifstream f(filepath.c_str(), std::ifstream::binary);
#endif
  if (!f) {
    if (err) {
      (*err) += "File does not exit or open error : " + filepath + "\n";
    }
    return false;
  }

  // For directory(and pipe?), peek() will fail(Posix gnustl/libc++ only)
  int buf = f.peek();
  (void)buf;
  if (!f) {
    if (err) {
      (*err) +=
          "File read error. Maybe empty file or invalid file : " + filepath +
          "\n";
    }
    return false;
  }

  f.seekg(0, f.end);
  size_t sz = static_cast<size_t>(f.tellg());
  f.seekg(0, f.beg);

  if (int64_t(sz) < 0) {
    if (err) {
      (*err) += "Invalid file size : " + filepath +
                " (does the path point to a directory?)";
    }
    return false;
  } else if (sz == 0) {
    if (err) {
      (*err) += "File is empty : " + filepath + "\n";
    }
    return false;
  } else if (uint64_t(sz) >= uint64_t(std::numeric_limits<int64_t>::max())) {
    // Posixish environment.
    if (err) {
      (*err) += "Invalid File(Pipe or special device?) : " + filepath + "\n";
    }
    return false;
  }

  sz = (std::min)(size_t(max_read_bytes), sz);

  out->resize(sz);
  f.read(reinterpret_cast<char *>(&out->at(0)),
         static_cast<std::streamsize>(sz));

  if (!f) {
    // read failure.
    if (err) {
      (*err) += "Failed to read file: " + filepath + "\n";
    }
    return false;
  }

  return true;
#endif
}